

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void memjrnlFreeChunks(MemJournal *p)

{
  FileChunk *pFVar1;
  FileChunk *pNext;
  FileChunk *pIter;
  MemJournal *p_local;
  
  pNext = p->pFirst;
  while (pNext != (FileChunk *)0x0) {
    pFVar1 = pNext->pNext;
    sqlite3_free(pNext);
    pNext = pFVar1;
  }
  p->pFirst = (FileChunk *)0x0;
  return;
}

Assistant:

static void memjrnlFreeChunks(MemJournal *p){
  FileChunk *pIter;
  FileChunk *pNext;
  for(pIter=p->pFirst; pIter; pIter=pNext){
    pNext = pIter->pNext;
    sqlite3_free(pIter);
  } 
  p->pFirst = 0;
}